

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

wchar_t map_get_editor(EditLine *el,wchar_t **editor)

{
  wchar_t wVar1;
  int *piVar2;
  
  wVar1 = L'\xffffffff';
  if (editor != (wchar_t **)0x0) {
    wVar1 = (el->el_map).type;
    if (wVar1 == L'\0') {
      piVar2 = anon_var_dwarf_a8f3;
    }
    else {
      if (wVar1 != L'\x01') {
        return L'\xffffffff';
      }
      piVar2 = anon_var_dwarf_af6b + 0x1a;
    }
    *editor = piVar2;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

libedit_private int
map_get_editor(EditLine *el, const wchar_t **editor)
{

	if (editor == NULL)
		return -1;
	switch (el->el_map.type) {
	case MAP_EMACS:
		*editor = L"emacs";
		return 0;
	case MAP_VI:
		*editor = L"vi";
		return 0;
	}
	return -1;
}